

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ssl_negotiate_alps(SSL_HANDSHAKE *hs,uint8_t *out_alert,SSL_CLIENT_HELLO *client_hello)

{
  undefined1 *puVar1;
  SSL *ssl;
  uchar *__first2;
  Span<const_unsigned_char> in;
  bool bVar2;
  bool bVar3;
  uint16_t uVar4;
  int iVar5;
  size_t sVar6;
  size_t in_R8;
  byte bVar7;
  uint16_t extension_type;
  Span<const_unsigned_char> protocol;
  Span<const_unsigned_char> settings;
  CBS alps_list;
  CBS protocol_name;
  CBS alps_contents;
  
  ssl = hs->ssl;
  if ((ssl->s3->alpn_selected).size_ == 0) {
    bVar3 = true;
  }
  else {
    settings.data_ = (uchar *)0x0;
    settings.size_ = 0;
    extension_type = 0x44cd;
    if ((*(ushort *)&hs->config->field_0x10d >> 0xd & 1) == 0) {
      extension_type = 0x4469;
    }
    uVar4 = ssl_protocol_version(ssl);
    bVar3 = true;
    if (((0x303 < uVar4) &&
        (protocol.size_ = in_R8, protocol.data_ = (uchar *)(ssl->s3->alpn_selected).size_,
        bVar2 = ssl_get_local_application_settings
                          ((bssl *)hs,(SSL_HANDSHAKE *)&settings,
                           (Span<const_unsigned_char> *)(ssl->s3->alpn_selected).data_,protocol),
        bVar2)) &&
       (bVar2 = ssl_client_hello_get_extension(client_hello,&alps_contents,extension_type), bVar2))
    {
      iVar5 = CBS_get_u16_length_prefixed(&alps_contents,&alps_list);
      if (((iVar5 == 0) || (alps_contents.len != 0)) || (alps_list.len == 0)) {
        iVar5 = 0xd85;
LAB_00134bf4:
        ERR_put_error(0x10,0,0x89,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,iVar5);
        *out_alert = '2';
      }
      else {
        bVar7 = 0;
        sVar6 = 1;
        while (sVar6 != 0) {
          iVar5 = CBS_get_u8_length_prefixed(&alps_list,&protocol_name);
          if ((iVar5 == 0) || (protocol_name.len == 0)) {
            iVar5 = 0xd8e;
            goto LAB_00134bf4;
          }
          __first2 = (ssl->s3->alpn_selected).data_;
          bVar3 = std::__equal4<unsigned_char_const*,unsigned_char_const*>
                            (protocol_name.data,protocol_name.data + protocol_name.len,__first2,
                             __first2 + (ssl->s3->alpn_selected).size_);
          bVar7 = bVar7 | bVar3;
          sVar6 = alps_list.len;
        }
        if (bVar7 == 0) {
          return true;
        }
        puVar1 = &((hs->new_session)._M_t.
                   super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->field_0x1b8;
        *puVar1 = *puVar1 | 0x40;
        in.size_ = settings.size_;
        in.data_ = settings.data_;
        bVar3 = Array<unsigned_char>::CopyFrom
                          (&((hs->new_session)._M_t.
                             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                            local_application_settings,in);
        if (bVar3) {
          return true;
        }
        *out_alert = 'P';
      }
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool ssl_negotiate_alps(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                        const SSL_CLIENT_HELLO *client_hello) {
  SSL *const ssl = hs->ssl;
  if (ssl->s3->alpn_selected.empty()) {
    return true;
  }

  // If we negotiate ALPN over TLS 1.3, try to negotiate ALPS.
  CBS alps_contents;
  Span<const uint8_t> settings;
  uint16_t extension_type = TLSEXT_TYPE_application_settings_old;
  if (hs->config->alps_use_new_codepoint) {
    extension_type = TLSEXT_TYPE_application_settings;
  }
  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION &&
      ssl_get_local_application_settings(hs, &settings,
                                         ssl->s3->alpn_selected) &&
      ssl_client_hello_get_extension(client_hello, &alps_contents,
                                     extension_type)) {
    // Check if the client supports ALPS with the selected ALPN.
    bool found = false;
    CBS alps_list;
    if (!CBS_get_u16_length_prefixed(&alps_contents, &alps_list) ||  //
        CBS_len(&alps_contents) != 0 ||                              //
        CBS_len(&alps_list) == 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      *out_alert = SSL_AD_DECODE_ERROR;
      return false;
    }
    while (CBS_len(&alps_list) > 0) {
      CBS protocol_name;
      if (!CBS_get_u8_length_prefixed(&alps_list, &protocol_name) ||
          // Empty protocol names are forbidden.
          CBS_len(&protocol_name) == 0) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
        *out_alert = SSL_AD_DECODE_ERROR;
        return false;
      }
      if (protocol_name == Span(ssl->s3->alpn_selected)) {
        found = true;
      }
    }

    // Negotiate ALPS if both client also supports ALPS for this protocol.
    if (found) {
      hs->new_session->has_application_settings = true;
      if (!hs->new_session->local_application_settings.CopyFrom(settings)) {
        *out_alert = SSL_AD_INTERNAL_ERROR;
        return false;
      }
    }
  }

  return true;
}